

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyRecord.cpp
# Opt level: O1

uint JsUtil::NoCaseComparer<Js::CaseInvariantPropertyListWithHashCode_*>::GetHashCode
               (CaseInvariantPropertyListWithHashCode *list)

{
  uint uVar1;
  Type pcVar2;
  code *pcVar3;
  bool bVar4;
  hash_t hVar5;
  undefined4 *puVar6;
  RecyclerWeakReference<const_Js::PropertyRecord> *pRVar7;
  undefined1 local_38 [8];
  CharacterBuffer<char16_t> string;
  
  if (list == (CaseInvariantPropertyListWithHashCode *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/PropertyRecord.cpp"
                       ,0xef,"(list != nullptr)","list != nullptr");
    if (!bVar4) goto LAB_0078e491;
    *puVar6 = 0;
  }
  if (*(int *)&(list->
               super_List<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ).field_0x2c == 0) {
    pRVar7 = List<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::CompactEnd<true>(&list->
                                 super_List<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                               );
    if (pRVar7 != (RecyclerWeakReference<const_Js::PropertyRecord> *)0x0) {
      pcVar2 = (pRVar7->super_RecyclerWeakReferenceBase).strongRef;
      if (pcVar2 == (Type)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/PropertyRecord.cpp"
                           ,0xf9,"(prop)","prop");
        if (!bVar4) {
LAB_0078e491:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar6 = 0;
      }
      uVar1 = *(uint *)(pcVar2 + 0x14);
      Memory::Recycler::WBSetBit((char *)local_38);
      local_38 = (undefined1  [8])(pcVar2 + 0x18);
      Memory::RecyclerWriteBarrierManager::WriteBarrier((CharacterBuffer<char16_t> *)local_38);
      string.string.ptr._0_4_ = uVar1 >> 1;
      hVar5 = NoCaseComparer<JsUtil::CharacterBuffer<char16_t>_>::GetHashCode
                        ((CharacterBuffer<char16_t> *)local_38);
      *(hash_t *)
       &(list->
        super_List<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ).field_0x2c = hVar5;
    }
  }
  return *(uint *)&(list->
                   super_List<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                   ).field_0x2c;
}

Assistant:

uint NoCaseComparer<Js::CaseInvariantPropertyListWithHashCode*>::GetHashCode(_In_ Js::CaseInvariantPropertyListWithHashCode* list)
    {
        Assert(list != nullptr);

        if (list->caseInvariantHashCode == 0)
        {
            const RecyclerWeakReference<Js::PropertyRecord const>* propRecordWeakRef = list->CompactEnd<true>();

            if (propRecordWeakRef != nullptr)
            {
                const Js::PropertyRecord* prop = propRecordWeakRef->Get();

                Assert(prop);

                JsUtil::CharacterBuffer<WCHAR> string(prop->GetBuffer(), prop->GetLength());

                list->caseInvariantHashCode = NoCaseComparer<JsUtil::CharacterBuffer<WCHAR> >::GetHashCode(string);
            }
        }

        return list->caseInvariantHashCode;
    }